

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<long,double>::MapAllocator<std::_Rb_tree_node<long*>>::construct<long*,long*>
          (MapAllocator<std::_Rb_tree_node<long*>> *this,long **p,long **args)

{
  long **args_local;
  long **p_local;
  MapAllocator<std::_Rb_tree_node<long_*>_> *this_local;
  
  *p = *args;
  return;
}

Assistant:

void construct(NodeType* p, Args&&... args) {
      // Clang 3.6 doesn't compile static casting to void* directly. (Issue
      // #1266) According C++ standard 5.2.9/1: "The static_cast operator shall
      // not cast away constness". So first the maybe const pointer is casted to
      // const void* and after the const void* is const casted.
      new (const_cast<void*>(static_cast<const void*>(p)))
          NodeType(std::forward<Args>(args)...);
    }